

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef::IfcRectangleHollowProfileDef
          (IfcRectangleHollowProfileDef *this)

{
  IfcRectangleHollowProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc8,"IfcRectangleHollowProfileDef");
  IfcRectangleProfileDef::IfcRectangleProfileDef
            (&this->super_IfcRectangleProfileDef,&PTR_construction_vtable_24__00fc3b58);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef,_3UL> *)
             &(this->super_IfcRectangleProfileDef).field_0x90,&PTR_construction_vtable_24__00fc3bd0)
  ;
  (this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xfc3aa0;
  *(undefined8 *)&this->field_0xc8 = 0xfc3b40;
  *(undefined8 *)
   &(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    field_0x58 = 0xfc3ac8;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.field_0x70 =
       0xfc3af0;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).field_0x90 = 0xfc3b18;
  STEP::Maybe<double>::Maybe(&this->InnerFilletRadius);
  STEP::Maybe<double>::Maybe(&this->OuterFilletRadius);
  return;
}

Assistant:

IfcRectangleHollowProfileDef() : Object("IfcRectangleHollowProfileDef") {}